

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QMetaMethodBuilderPrivate * __thiscall QMetaMethodBuilder::d_func(QMetaMethodBuilder *this)

{
  QMetaObjectBuilder *extraout_RAX;
  QMetaObjectBuilder *pQVar1;
  pointer pQVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pQVar1 = this->_mobj;
  if (pQVar1 != (QMetaObjectBuilder *)0x0) {
    uVar3 = this->_index;
    uVar4 = (ulong)(int)uVar3;
    if (-1 < (long)uVar4) {
      pQVar2 = (pQVar1->d->methods).
               super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(pQVar1->d->methods).
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 3) *
              0x4ec4ec4ec4ec4ec5;
      if ((int)uVar5 <= (int)uVar3) {
        return (QMetaMethodBuilderPrivate *)0x0;
      }
      if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) goto LAB_0028b40b;
      d_func();
      uVar3 = (uint)uVar4;
      pQVar1 = extraout_RAX;
    }
    pQVar2 = (pQVar1->d->constructors).
             super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(pQVar1->d->constructors).
                   super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 3) *
            0x4ec4ec4ec4ec4ec5;
    if ((int)-uVar3 <= (int)uVar5) {
      uVar4 = (ulong)~uVar3;
      if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
        d_func();
      }
LAB_0028b40b:
      return pQVar2 + uVar4;
    }
  }
  return (QMetaMethodBuilderPrivate *)0x0;
}

Assistant:

QMetaMethodBuilderPrivate *QMetaMethodBuilder::d_func() const
{
    // Positive indices indicate methods, negative indices indicate constructors.
    if (_mobj && _index >= 0 && _index < int(_mobj->d->methods.size()))
        return &(_mobj->d->methods[_index]);
    else if (_mobj && -_index >= 1 && -_index <= int(_mobj->d->constructors.size()))
        return &(_mobj->d->constructors[(-_index) - 1]);
    else
        return nullptr;
}